

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_syntaxv_ds(arg_dstr_t ds,void **argtable,char *suffix)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  char *str;
  long lVar5;
  char syntax [200];
  char *in_stack_fffffffffffffef8;
  char local_f8 [200];
  
  lVar5 = 0;
  while ((pbVar2 = (byte *)argtable[lVar5], pbVar2 != (byte *)0x0 && ((*pbVar2 & 1) == 0))) {
    iVar4 = 0;
    memset(local_f8,0,200);
    arg_cat_optionv(local_f8,*(size_t *)(pbVar2 + 8),*(char **)(pbVar2 + 0x10),
                    *(char **)(pbVar2 + 0x18),(char *)(ulong)(*pbVar2 & 4),0x11134a,
                    in_stack_fffffffffffffef8);
    while( true ) {
      iVar1 = *(int *)((long)argtable[lVar5] + 0x28);
      if (iVar1 <= iVar4) break;
      arg_dstr_cat(ds," ");
      arg_dstr_cat(ds,local_f8);
      iVar4 = iVar4 + 1;
    }
    iVar4 = *(int *)((long)argtable[lVar5] + 0x2c);
    iVar3 = iVar4 - iVar1;
    if (iVar4 != iVar1) {
      str = "]";
      if (iVar3 != 1) {
        if (iVar3 == 2) {
          arg_dstr_cat(ds," [");
          arg_dstr_cat(ds,local_f8);
          str = "]";
          arg_dstr_cat(ds,"]");
        }
        else {
          str = "]...";
        }
      }
      arg_dstr_cat(ds," [");
      arg_dstr_cat(ds,local_f8);
      arg_dstr_cat(ds,str);
    }
    lVar5 = lVar5 + 1;
  }
  if (suffix != (char *)0x0) {
    arg_dstr_cat(ds,suffix);
  }
  return;
}

Assistant:

void arg_print_syntaxv_ds(arg_dstr_t ds, void** argtable, const char* suffix) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int i, tabindex;

    /* print remaining options in abbreviated style */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        char syntax[200] = "";
        const char *shortopts, *longopts, *datatype;

        shortopts = table[tabindex]->shortopts;
        longopts = table[tabindex]->longopts;
        datatype = table[tabindex]->datatype;
        arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, "|");

        /* print mandatory options */
        for (i = 0; i < table[tabindex]->mincount; i++) {
            arg_dstr_cat(ds, " ");
            arg_dstr_cat(ds, syntax);
        }

        /* print optional args enclosed in "[..]" */
        switch (table[tabindex]->maxcount - table[tabindex]->mincount) {
            case 0:
                break;
            case 1:
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]");
                break;
            case 2:
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]");
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]");
                break;
            default:
                arg_dstr_cat(ds, " [");
                arg_dstr_cat(ds, syntax);
                arg_dstr_cat(ds, "]...");
                break;
        }
    }

    if (suffix) {
        arg_dstr_cat(ds, (char*)suffix);
    }
}